

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsItem::scroll(QGraphicsItem *this,qreal dx,qreal dy,QRectF *rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QGraphicsItemPrivate *this_00;
  undefined4 uVar4;
  KeyData *pKVar3;
  int iVar5;
  int iVar6;
  QRect QVar7;
  char cVar8;
  QGraphicsItemCache *pQVar9;
  QList<QRectF> *this_01;
  pointer pQVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  QRect *exposedRect;
  QRectF *pQVar13;
  long lVar14;
  long in_FS_OFFSET;
  ulong uVar15;
  double dVar16;
  QRegion exposed;
  undefined1 local_88 [16];
  double local_78;
  qreal qStack_70;
  QRect local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  QVar7._8_8_ = local_68._8_8_;
  QVar7._0_8_ = local_68._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  if (((((dx != 0.0) || (NAN(dx))) || (dy != 0.0)) || (NAN(dy))) &&
     (local_68 = QVar7, this_00->scene != (QGraphicsScene *)0x0)) {
    if (((((*(uint *)&this_00->field_0x160 & 0x600000) != 0x200000) ||
         (dVar16 = dx - (double)(int)dx, uVar15 = -(ulong)(dVar16 < -dVar16),
         1e-12 < (double)(~uVar15 & (ulong)dVar16 | (ulong)-dVar16 & uVar15))) ||
        ((dVar16 = dy - (double)(int)dy, uVar15 = -(ulong)(dVar16 < -dVar16),
         1e-12 < (double)(~uVar15 & (ulong)dVar16 | (ulong)-dVar16 & uVar15) ||
         (pQVar9 = QGraphicsItemPrivate::extraItemCache(this_00), pQVar9->allExposed != false)))) ||
       ((-1 < (pQVar9->fixedSize).wd.m_i && (-1 < (pQVar9->fixedSize).ht.m_i)))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        update(this,rect);
        return;
      }
      goto LAB_005e079d;
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)&local_58);
    cVar8 = QPixmapCache::find(&pQVar9->key,(QPixmap *)&local_58);
    if (cVar8 == '\0') {
      update(this,rect);
    }
    else {
      if ((((rect->w != 0.0) || (NAN(rect->w))) || (rect->h != 0.0)) || (NAN(rect->h))) {
        local_88._0_8_ = rect->xp;
        local_88._8_8_ = rect->yp;
        local_78 = rect->w;
        qStack_70 = rect->h;
      }
      else {
        (*this->_vptr_QGraphicsItem[3])(local_88,this);
      }
      local_68 = (QRect)QRectF::toAlignedRect();
      cVar8 = QRect::intersects(&local_68);
      if (cVar8 != '\0') {
        QPixmapCache::remove(&pQVar9->key);
        exposed.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion(&exposed);
        uVar1 = (pQVar9->boundingRect).x1;
        uVar4 = (pQVar9->boundingRect).y1;
        local_88._0_8_ = CONCAT44(local_68.y1.m_i - uVar4,local_68.x1.m_i - uVar1);
        local_88._8_8_ = CONCAT44(local_68.y2.m_i - uVar4,local_68.x2.m_i - uVar1);
        QPixmap::scroll((int)&local_58,(int)dx,(QRect *)(ulong)(uint)(int)dy,(QRegion *)local_88);
        QPixmapCache::insert((QPixmap *)local_88);
        pKVar3 = (pQVar9->key).d;
        (pQVar9->key).d = (KeyData *)local_88._0_8_;
        local_88._0_8_ = pKVar3;
        QPixmapCache::Key::~Key((Key *)local_88);
        this_01 = &pQVar9->exposed;
        if ((pQVar9->exposed).d.size != 0) {
          lVar14 = 0;
          uVar15 = 0;
          do {
            pQVar10 = QList<QRectF>::data(this_01);
            pQVar13 = (QRectF *)((long)&pQVar10->xp + lVar14);
            if (((rect->w != 0.0) || (NAN(rect->w))) || ((rect->h != 0.0 || (NAN(rect->h))))) {
              cVar8 = QRectF::intersects(pQVar13);
              if (cVar8 != '\0') goto LAB_005e0668;
            }
            else {
LAB_005e0668:
              pQVar13->xp = pQVar13->xp + dx;
              pQVar13->yp = pQVar13->yp + dy;
            }
            uVar15 = uVar15 + 1;
            lVar14 = lVar14 + 0x20;
          } while (uVar15 < (ulong)(pQVar9->exposed).d.size);
        }
        uVar2 = (pQVar9->boundingRect).x1;
        QRegion::translate((int)&exposed,uVar2);
        puVar11 = (undefined8 *)QRegion::begin();
        puVar12 = (undefined8 *)QRegion::end();
        for (; puVar11 != puVar12; puVar11 = puVar11 + 2) {
          iVar5 = (int)*puVar11;
          iVar6 = (int)((ulong)*puVar11 >> 0x20);
          dVar16 = (double)iVar6;
          local_88._8_4_ = SUB84(dVar16,0);
          local_88._0_8_ = (double)iVar5;
          local_88._12_4_ = (int)((ulong)dVar16 >> 0x20);
          local_78 = (double)(((long)*(int *)(puVar11 + 1) - (long)iVar5) + 1);
          qStack_70 = (qreal)(((long)*(int *)((long)puVar11 + 0xc) - (long)iVar6) + 1);
          QtPrivate::QMovableArrayOps<QRectF>::emplace<QRectF>
                    ((QMovableArrayOps<QRectF> *)this_01,(pQVar9->exposed).d.size,(QRectF *)local_88
                    );
          QList<QRectF>::end(this_01);
        }
        QGraphicsScenePrivate::markDirty
                  (*(QGraphicsScenePrivate **)&this_00->scene->field_0x8,this,rect,false,false,false
                   ,false,false);
        QRegion::~QRegion(&exposed);
      }
    }
    QPixmap::~QPixmap((QPixmap *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005e079d:
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::scroll(qreal dx, qreal dy, const QRectF &rect)
{
    Q_D(QGraphicsItem);
    if (dx == 0.0 && dy == 0.0)
        return;
    if (!d->scene)
        return;

    // Accelerated scrolling means moving pixels from one location to another
    // and only redraw the newly exposed area. The following requirements must
    // be fulfilled in order to do that:
    //
    // 1) Item is opaque.
    // 2) Item is not overlapped by other items.
    //
    // There's (yet) no way to detect whether an item is opaque or not, which means
    // we cannot do accelerated scrolling unless the cache is enabled. In case of using
    // DeviceCoordinate cache we also have to take the device transform into account in
    // order to determine whether we can do accelerated scrolling or not. That's left out
    // for simplicity here, but it is definitely something we can consider in the future
    // as a performance improvement.
    if (d->cacheMode != QGraphicsItem::ItemCoordinateCache
        || !qFuzzyIsNull(dx - int(dx)) || !qFuzzyIsNull(dy - int(dy))) {
        update(rect);
        return;
    }

    QGraphicsItemCache *cache = d->extraItemCache();
    if (cache->allExposed || cache->fixedSize.isValid()) {
        // Cache is either invalidated or item is scaled (see QGraphicsItem::setCacheMode).
        update(rect);
        return;
    }

    // Find pixmap in cache.
    QPixmap cachedPixmap;
    if (!QPixmapCache::find(cache->key, &cachedPixmap)) {
        update(rect);
        return;
    }

    QRect scrollRect = (rect.isNull() ? boundingRect() : rect).toAlignedRect();
    if (!scrollRect.intersects(cache->boundingRect))
        return; // Nothing to scroll.

    // Remove from cache to avoid deep copy when modifying.
    QPixmapCache::remove(cache->key);

    QRegion exposed;
    cachedPixmap.scroll(dx, dy, scrollRect.translated(-cache->boundingRect.topLeft()), &exposed);

    // Reinsert into cache.
    cache->key = QPixmapCache::insert(cachedPixmap);

    // Translate the existing expose.
    for (int i = 0; i < cache->exposed.size(); ++i) {
        QRectF &e = cache->exposed[i];
        if (!rect.isNull() && !e.intersects(rect))
            continue;
        e.translate(dx, dy);
    }

    // Append newly exposed areas. Note that the exposed region is currently
    // in pixmap coordinates, so we have to translate it to item coordinates.
    exposed.translate(cache->boundingRect.topLeft());
    for (const QRect &exposedRect : exposed)
        cache->exposed += exposedRect;

    // Trigger update. This will redraw the newly exposed area and make sure
    // the pixmap is re-blitted in case there are overlapping items.
    d->scene->d_func()->markDirty(this, rect);
}